

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  ulong extraout_RAX;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  __m256 afVar11;
  undefined1 auVar13 [56];
  undefined1 auVar12 [64];
  __m128 afVar14;
  binary_op_pow op;
  __m256 _p1;
  __m256 _p;
  binary_op_pow local_d5;
  uint local_d4;
  void *local_d0;
  Mat *local_c8;
  Mat *local_c0;
  Mat *local_b8;
  ulong local_b0;
  ulong local_a8;
  __m256 local_a0;
  float local_80 [2];
  float afStack_78 [2];
  float afStack_70 [2];
  float afStack_68 [14];
  
  local_d4 = a->h * a->w * a->d * a->elempack;
  uVar4 = (ulong)local_d4;
  local_a8 = 0;
  local_c8 = b;
  local_c0 = a;
  local_b8 = c;
  local_b0 = (ulong)(uint)a->c;
  if (a->c < 1) {
    local_b0 = local_a8;
  }
  for (; local_a8 != local_b0; local_a8 = local_a8 + 1) {
    local_d0 = (void *)(local_c8->elemsize * local_c8->cstep * local_a8 + (long)local_c8->data);
    lVar7 = local_b8->elemsize * local_b8->cstep * local_a8;
    pvVar2 = local_b8->data;
    lVar6 = local_c0->elemsize * local_c0->cstep * local_a8;
    pvVar3 = local_c0->data;
    lVar5 = 0;
    lVar8 = 0;
    for (iVar9 = 0; iVar9 + 7 < (int)local_d4; iVar9 = iVar9 + 8) {
      pfVar1 = (float *)((long)pvVar3 + lVar8 + lVar6);
      local_80 = *(float (*) [2])pfVar1;
      afStack_78 = *(float (*) [2])(pfVar1 + 2);
      afStack_70 = *(float (*) [2])(pfVar1 + 4);
      afStack_68._0_8_ = *(undefined8 *)(pfVar1 + 6);
      local_a0 = *(__m256 *)((long)local_d0 + lVar8);
      afVar11 = local_a0;
      BinaryOp_x86_avx_functor::binary_op_pow::func_pack8(&local_d5,(__m256 *)local_80,&local_a0);
      *(__m256 *)((long)pvVar2 + lVar8 + lVar7) = afVar11;
      lVar8 = lVar8 + 0x20;
      lVar5 = lVar5 + 8;
    }
    for (; uVar4 = (ulong)(iVar9 + 3U), (int)(iVar9 + 3U) < (int)local_d4; iVar9 = iVar9 + 4) {
      pfVar1 = (float *)((long)pvVar3 + lVar8 + lVar6);
      local_80 = *(float (*) [2])pfVar1;
      afStack_78 = *(float (*) [2])(pfVar1 + 2);
      local_a0._0_16_ = *(undefined1 (*) [16])((long)local_d0 + lVar8);
      auVar13 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_d0 + lVar8) + 8));
      afVar14 = BinaryOp_x86_avx_functor::binary_op_pow::func_pack4
                          (&local_d5,(__m128 *)local_80,(__m128 *)local_a0);
      auVar12._0_8_ = afVar14._0_8_;
      auVar12._8_56_ = auVar13;
      *(undefined1 (*) [16])((long)pvVar2 + lVar8 + lVar7) = auVar12._0_16_;
      lVar8 = lVar8 + 0x10;
      lVar5 = lVar5 + 4;
    }
    for (; (int)lVar5 < (int)local_d4; lVar5 = lVar5 + 1) {
      fVar10 = powf(*(float *)((long)pvVar3 + lVar5 * 4 + lVar6),
                    *(float *)((long)local_d0 + lVar5 * 4));
      *(float *)((long)pvVar2 + lVar5 * 4 + lVar7) = fVar10;
      uVar4 = extraout_RAX;
    }
  }
  return (int)uVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}